

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

bool __thiscall
deqp::UniformBlockCase::compareTypes
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  pointer pUVar1;
  ostringstream *poVar2;
  int iVar3;
  TestLog *pTVar4;
  UniformBlock *pUVar5;
  pointer pBVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  ostream *poVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  pointer pUVar18;
  undefined1 local_328 [384];
  ostringstream instanceName;
  
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  uVar13 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                         super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_uniformBlocks.
                        super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar16 = 0;
  uVar14 = uVar13 & 0xffffffff;
  if ((int)uVar13 < 1) {
    uVar14 = uVar16;
  }
  bVar7 = true;
  for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    pUVar5 = (this->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16];
    iVar3 = pUVar5->m_arraySize;
    iVar12 = 0;
    iVar15 = iVar3;
    if (iVar3 < 1) {
      iVar15 = 1;
    }
    while( true ) {
      if (iVar12 == iVar15) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&instanceName);
      std::operator<<((ostream *)&instanceName,(pUVar5->m_blockName)._M_dataplus._M_p);
      if (0 < iVar3) {
        poVar10 = std::operator<<((ostream *)&instanceName,"[");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar12);
        std::operator<<(poVar10,"]");
      }
      std::__cxx11::stringbuf::str();
      uVar8 = ub::UniformLayout::getBlockIndex(cmpLayout,(char *)local_328._0_8_);
      std::__cxx11::string::~string((string *)local_328);
      if (-1 < (int)uVar8) {
        pBVar6 = (cmpLayout->blocks).
                 super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (piVar17 = *(int **)&pBVar6[uVar8].activeUniformIndices.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar17 !=
            *(pointer *)
             ((long)&pBVar6[uVar8].activeUniformIndices.
                     super__Vector_base<int,_std::allocator<int>_> + 8); piVar17 = piVar17 + 1) {
          pUVar18 = (cmpLayout->uniforms).
                    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pUVar1 = pUVar18 + *piVar17;
          uVar9 = ub::UniformLayout::getUniformIndex
                            (refLayout,pUVar18[*piVar17].name._M_dataplus._M_p);
          if ((int)uVar9 < 0) {
            poVar2 = (ostringstream *)(local_328 + 8);
            local_328._0_8_ = pTVar4;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"Error: Uniform \'");
            std::operator<<((ostream *)poVar2,(string *)pUVar1);
            std::operator<<((ostream *)poVar2,"\' not found in reference layout");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            bVar7 = false;
          }
          else {
            pUVar18 = (refLayout->uniforms).
                      super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pUVar18[uVar9].type != pUVar1->type) {
              poVar2 = (ostringstream *)(local_328 + 8);
              local_328._0_8_ = pTVar4;
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,"Error: Uniform type mismatch in \'");
              pUVar18 = pUVar18 + uVar9;
              std::operator<<((ostream *)poVar2,(string *)pUVar18);
              std::operator<<((ostream *)poVar2,"\':\n");
              std::operator<<((ostream *)poVar2,"  expected: ");
              pcVar11 = glu::getDataTypeName(pUVar18->type);
              std::operator<<((ostream *)poVar2,pcVar11);
              std::operator<<((ostream *)poVar2,"\n");
              std::operator<<((ostream *)poVar2,"  got: ");
              pcVar11 = glu::getDataTypeName(pUVar1->type);
              std::operator<<((ostream *)poVar2,pcVar11);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              bVar7 = false;
            }
          }
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&instanceName);
      iVar12 = iVar12 + 1;
    }
  }
  return bVar7;
}

Assistant:

bool UniformBlockCase::compareTypes(const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog& log	   = m_testCtx.getLog();
	bool	 isOk	  = true;
	int		 numBlocks = m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock& block		 = m_interface.getUniformBlock(blockNdx);
		bool				isArray		 = block.isArray();
		int					numInstances = isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::ostringstream instanceName;

			instanceName << block.getBlockName();
			if (isArray)
				instanceName << "[" << instanceNdx << "]";

			int cmpBlockNdx = cmpLayout.getBlockIndex(instanceName.str().c_str());

			if (cmpBlockNdx < 0)
				continue;

			const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

			for (vector<int>::const_iterator ndxIter = cmpBlockLayout.activeUniformIndices.begin();
				 ndxIter != cmpBlockLayout.activeUniformIndices.end(); ndxIter++)
			{
				const UniformLayoutEntry& cmpEntry	= cmpLayout.uniforms[*ndxIter];
				int						  refEntryNdx = refLayout.getUniformIndex(cmpEntry.name.c_str());

				if (refEntryNdx < 0)
				{
					log << TestLog::Message << "Error: Uniform '" << cmpEntry.name << "' not found in reference layout"
						<< TestLog::EndMessage;
					isOk = false;
					continue;
				}

				const UniformLayoutEntry& refEntry = refLayout.uniforms[refEntryNdx];

				// \todo [2012-11-26 pyry] Should we check other properties as well?
				if (refEntry.type != cmpEntry.type)
				{
					log << TestLog::Message << "Error: Uniform type mismatch in '" << refEntry.name << "':\n"
						<< "  expected: " << glu::getDataTypeName(refEntry.type) << "\n"
						<< "  got: " << glu::getDataTypeName(cmpEntry.type) << TestLog::EndMessage;
					isOk = false;
				}
			}
		}
	}

	return isOk;
}